

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtconcurrentthreadengine.cpp
# Opt level: O2

void __thiscall QtConcurrent::ThreadEngineBase::run(ThreadEngineBase *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isCanceled(this);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      threadExit(this);
      return;
    }
  }
  else {
    startThreads(this);
    while( true ) {
      iVar3 = (**(code **)(*(long *)this + 0x28))(this);
      if (iVar3 != 0) break;
      bVar2 = ThreadEngineBarrier::releaseUnlessLast(&this->barrier);
      if (bVar2) goto LAB_00103112;
      reportIfSuspensionDone(this);
    }
    threadExit(this);
LAB_00103112:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void ThreadEngineBase::run() // implements QRunnable.
{
    if (this->isCanceled()) {
        threadExit();
        return;
    }

    startThreads();

#ifndef QT_NO_EXCEPTIONS
    try {
#endif
        while (threadFunction() == ThrottleThread) {
            // threadFunction returning ThrottleThread means it that the user
            // struct wants to be throttled by making a worker thread exit.
            // Respect that request unless this is the only worker thread left
            // running, in which case it has to keep going.
            if (threadThrottleExit()) {
                return;
            } else {
                // If the last worker thread is throttled and the state is "suspending",
                // it means that suspension has been requested, and it is already
                // in effect (because all previous threads have already exited).
                // Report the "Suspended" state.
                reportIfSuspensionDone();
            }
        }

#ifndef QT_NO_EXCEPTIONS
    } catch (QException &e) {
        handleException(e);
    } catch (...) {
        handleException(QUnhandledException(std::current_exception()));
    }
#endif
    threadExit();
}